

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O0

bool __thiscall
nuraft::snapshot_io_mgr::push
          (snapshot_io_mgr *this,ptr<raft_server> *r,ptr<peer> *p,
          function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
          *h)

{
  byte bVar1;
  element_type *this_00;
  shared_ptr<nuraft::peer> *in_RDX;
  shared_ptr<nuraft::snapshot_sync_ctx> *in_RSI;
  peer *in_RDI;
  ptr<snapshot_io_mgr::io_queue_elem> *in_stack_00000020;
  snapshot_io_mgr *in_stack_00000028;
  ptr<io_queue_elem> elem;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  shared_ptr<nuraft::peer> *args_1;
  
  args_1 = in_RDX;
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x28773d
            );
  peer::get_snapshot_sync_ctx(in_RDI);
  this_00 = std::
            __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x287759);
  snapshot_sync_ctx::get_snapshot(this_00);
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x287772
            );
  peer::get_snapshot_sync_ctx(in_RDI);
  cs_new<nuraft::snapshot_io_mgr::io_queue_elem,std::shared_ptr<nuraft::raft_server>&,std::shared_ptr<nuraft::snapshot>const&,std::shared_ptr<nuraft::snapshot_sync_ctx>,std::shared_ptr<nuraft::peer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&>
            ((shared_ptr<nuraft::raft_server> *)in_RDI,(shared_ptr<nuraft::snapshot> *)args_1,in_RSI
             ,in_RDX,(function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                      *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
            ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x2877b0);
  std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
            ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x2877ba);
  bVar1 = push(in_stack_00000028,in_stack_00000020);
  std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>::~shared_ptr
            ((shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem> *)0x2877d9);
  return (bool)(bVar1 & 1);
}

Assistant:

bool snapshot_io_mgr::push(ptr<raft_server> r,
                           ptr<peer> p,
                           std::function< void(ptr<resp_msg>&, ptr<rpc_exception>&) >& h)
{
    ptr<io_queue_elem> elem =
        cs_new<io_queue_elem>( r,
                               p->get_snapshot_sync_ctx()->get_snapshot(),
                               p->get_snapshot_sync_ctx(),
                               p,
                               h );
    return push(elem);
}